

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDressMapIds(Aig_Man_t *pMiter,Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  void **ppvVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int Addition;
  int Addition_00;
  int Fill;
  int iVar7;
  int iVar8;
  
  p = (Vec_Ptr_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  p->pArray = ppvVar4;
  Abc_NtkDressMapSetPolarity(pNtk1);
  Abc_NtkDressMapSetPolarity(pNtk2);
  p_00 = Abc_NtkDressMapClasses(pMiter,pNtk1);
  p_01 = Abc_NtkDressMapClasses(pMiter,pNtk2);
  p_02 = Vec_IntStart(pMiter->vObjs->nSize);
  iVar8 = p_00->nSize;
  iVar7 = 0;
  if (iVar8 < 1) {
    iVar8 = 0;
    iVar7 = 0;
  }
  for (; iVar8 != iVar7; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(p_00,iVar7);
    if (-1 < iVar1) {
      Vec_IntAddToEntry(p_02,iVar1,Addition);
    }
  }
  p_03 = Vec_IntStart(pMiter->vObjs->nSize);
  iVar1 = 0;
  iVar7 = p_01->nSize;
  if (p_01->nSize < 1) {
    iVar7 = iVar1;
  }
  for (; iVar7 != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar1);
    if (-1 < iVar2) {
      Vec_IntAddToEntry(p_03,iVar2,Addition_00);
    }
  }
  pVVar5 = Vec_IntAlloc(100);
  for (iVar1 = 0; iVar8 != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar1);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjDressMakeId(pNtk1,iVar1,0);
      Vec_IntPush(pVVar5,iVar2);
    }
  }
  for (iVar1 = 0; iVar7 != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_01,iVar1);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjDressMakeId(pNtk2,iVar1,1);
      Vec_IntPush(pVVar5,iVar2);
    }
  }
  Vec_PtrPush(p,pVVar5);
  pVVar5 = Vec_IntAlloc(0);
  Vec_IntFill(pVVar5,pMiter->vObjs->nSize,Fill);
  for (iVar1 = 0; iVar8 != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar1);
    if (0 < iVar2) {
      iVar3 = Vec_IntEntry(p_02,iVar2);
      if (iVar3 != 0) {
        iVar3 = Vec_IntEntry(p_03,iVar2);
        if (iVar3 != 0) {
          pVVar6 = Abc_ObjDressClass(p,pVVar5,iVar2);
          iVar2 = Abc_ObjDressMakeId(pNtk1,iVar1,0);
          Vec_IntPush(pVVar6,iVar2);
        }
      }
    }
  }
  for (iVar8 = 0; iVar7 != iVar8; iVar8 = iVar8 + 1) {
    iVar1 = Vec_IntEntry(p_01,iVar8);
    if (0 < iVar1) {
      iVar2 = Vec_IntEntry(p_02,iVar1);
      if (iVar2 != 0) {
        iVar2 = Vec_IntEntry(p_03,iVar1);
        if (iVar2 != 0) {
          pVVar6 = Abc_ObjDressClass(p,pVVar5,iVar1);
          iVar1 = Abc_ObjDressMakeId(pNtk2,iVar8,1);
          Vec_IntPush(pVVar6,iVar1);
        }
      }
    }
  }
  Vec_IntFree(pVVar5);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkDressMapIds( Aig_Man_t * pMiter, Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2 )
{
    Vec_Ptr_t * vRes;
    Vec_Int_t * vId2Lit1, * vId2Lit2, * vCounts0, * vCounts1, * vClassC, * vClass2Num;
    int i, Class;
    // start the classes
    vRes = Vec_PtrAlloc( 1000 );
    // set polarity of the nodes
    Abc_NtkDressMapSetPolarity( pNtk1 );
    Abc_NtkDressMapSetPolarity( pNtk2 );
    // create mapping of node IDs of pNtk1/pNtk2 into the IDs of equiv classes of pMiter
    vId2Lit1 = Abc_NtkDressMapClasses( pMiter, pNtk1 );
    vId2Lit2 = Abc_NtkDressMapClasses( pMiter, pNtk2 );
    // count the number of nodes in each equivalence class
    vCounts0 = Vec_IntStart( Aig_ManObjNumMax(pMiter) );
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class >= 0 )
            Vec_IntAddToEntry( vCounts0, Class, 1 );
    vCounts1 = Vec_IntStart( Aig_ManObjNumMax(pMiter) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class >= 0 )
            Vec_IntAddToEntry( vCounts1, Class, 1 );
    // get the costant class
    vClassC = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class == 0 )
            Vec_IntPush( vClassC, Abc_ObjDressMakeId(pNtk1, i, 0) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class == 0 )
            Vec_IntPush( vClassC, Abc_ObjDressMakeId(pNtk2, i, 1) );
    Vec_PtrPush( vRes, vClassC );
    // map repr node IDs into class numbers
    vClass2Num = Vec_IntAlloc( 0 );
    Vec_IntFill( vClass2Num, Aig_ManObjNumMax(pMiter), -1 );
    // keep classes having at least one element from pNtk1 and one from pNtk2
    Vec_IntForEachEntry( vId2Lit1, Class, i )
        if ( Class > 0 && Vec_IntEntry(vCounts0, Class) && Vec_IntEntry(vCounts1, Class) )
            Vec_IntPush( Abc_ObjDressClass(vRes, vClass2Num, Class), Abc_ObjDressMakeId(pNtk1, i, 0) );
    Vec_IntForEachEntry( vId2Lit2, Class, i )
        if ( Class > 0 && Vec_IntEntry(vCounts0, Class) && Vec_IntEntry(vCounts1, Class) )
            Vec_IntPush( Abc_ObjDressClass(vRes, vClass2Num, Class), Abc_ObjDressMakeId(pNtk2, i, 1) );
    // package them accordingly
    Vec_IntFree( vClass2Num );
    Vec_IntFree( vCounts0 );
    Vec_IntFree( vCounts1 );
    Vec_IntFree( vId2Lit1 );
    Vec_IntFree( vId2Lit2 );
    return vRes;
}